

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O1

void Tim_ManBlackBoxIoNum(Tim_Man_t *p,int *pnBbIns,int *pnBbOuts)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  long lVar3;
  
  *pnBbOuts = 0;
  *pnBbIns = 0;
  if (((p->vBoxes != (Vec_Ptr_t *)0x0) && (p->vBoxes->nSize != 0)) &&
     (pVVar2 = p->vBoxes, 0 < pVVar2->nSize)) {
    lVar3 = 0;
    do {
      if (*(int *)((long)pVVar2->pArray[lVar3] + 0x18) != 0) {
        iVar1 = Tim_ManBoxInputNum(p,(int)lVar3);
        *pnBbIns = *pnBbIns + iVar1;
        iVar1 = Tim_ManBoxOutputNum(p,(int)lVar3);
        *pnBbOuts = *pnBbOuts + iVar1;
      }
      lVar3 = lVar3 + 1;
      pVVar2 = p->vBoxes;
    } while (lVar3 < pVVar2->nSize);
  }
  return;
}

Assistant:

void Tim_ManBlackBoxIoNum( Tim_Man_t * p, int * pnBbIns, int * pnBbOuts )
{
    Tim_Box_t * pBox;
    int i;
    *pnBbIns = *pnBbOuts = 0;
    if ( Tim_ManBoxNum(p) )
        Tim_ManForEachBox( p, pBox, i )
        {
            if ( !pBox->fBlack )//&& pBox->nInputs <= 6 )
                continue;
            *pnBbIns  += Tim_ManBoxInputNum( p, i );
            *pnBbOuts += Tim_ManBoxOutputNum( p, i );
        }
}